

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify.cpp
# Opt level: O0

pair<unsigned_int,_embree::Ref<embree::SceneGraph::Node>_> __thiscall
embree::VerifyScene::addSphereHair
          (VerifyScene *this,RandomSampler *sampler,RTCBuildQuality quality,Vec3fa *center,
          float radius,avector<Vec3fa> *motion_vector)

{
  Node *extraout_RDX;
  undefined8 in_RDI;
  long in_R9;
  pair<unsigned_int,_embree::Ref<embree::SceneGraph::Node>_> pVar2;
  Ref<embree::SceneGraph::Node> node;
  Ref<embree::SceneGraph::MaterialNode> *in_stack_00000160;
  float in_stack_0000016c;
  Vec3fa *in_stack_00000170;
  avector<Vec3fa> *in_stack_00000710;
  Ref<embree::SceneGraph::Node> *in_stack_00000718;
  Ref<embree::SceneGraph::Node> *in_stack_fffffffffffffee8;
  RTCBuildQuality in_stack_fffffffffffffef4;
  VerifyScene *in_stack_fffffffffffffef8;
  long *local_b8 [3];
  long *local_a0;
  long *local_98;
  long local_90;
  long **local_58;
  long **local_48;
  undefined8 local_38;
  long **local_30;
  long **local_28;
  long local_18;
  long **local_10;
  long **local_8;
  Ref<embree::SceneGraph::Node> RVar1;
  
  local_30 = &local_a0;
  local_a0 = (long *)0x0;
  local_38 = 0;
  local_90 = in_R9;
  SceneGraph::createSphereShapedHair(in_stack_00000170,in_stack_0000016c,in_stack_00000160);
  local_28 = &local_a0;
  if (local_a0 != (long *)0x0) {
    (**(code **)(*local_a0 + 0x18))();
  }
  local_18 = local_90;
  if (*(long *)(local_90 + 8) != 0) {
    local_8 = local_b8;
    local_10 = &local_98;
    local_b8[0] = local_98;
    if (local_98 != (long *)0x0) {
      (**(code **)(*local_98 + 0x10))();
    }
    SceneGraph::set_motion_vector(in_stack_00000718,in_stack_00000710);
    local_58 = local_b8;
    if (local_b8[0] != (long *)0x0) {
      (**(code **)(*local_b8[0] + 0x18))();
    }
  }
  pVar2 = addGeometry2(in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,in_stack_fffffffffffffee8
                      );
  RVar1 = pVar2.second.ptr;
  local_48 = &local_98;
  if (local_98 != (long *)0x0) {
    (**(code **)(*local_98 + 0x18))();
    RVar1.ptr = extraout_RDX;
  }
  pVar2.second.ptr = RVar1.ptr;
  pVar2._0_8_ = in_RDI;
  return pVar2;
}

Assistant:

std::pair<unsigned,Ref<SceneGraph::Node>> addSphereHair (RandomSampler& sampler, RTCBuildQuality quality, const Vec3fa& center, const float radius, const avector<Vec3fa>& motion_vector = avector<Vec3fa>())
    {
      Ref<SceneGraph::Node> node = SceneGraph::createSphereShapedHair(center,radius);
      if (motion_vector.size()) SceneGraph::set_motion_vector(node,motion_vector);
      return addGeometry2(quality,node);
    }